

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,PrimitiveInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params_00;
  bool bVar1;
  NetType *implicitNetNames_00;
  HierarchicalInstanceSyntax *instanceSyntax_00;
  long in_RDX;
  ASTContext *context_00;
  Token *in_R9;
  string_view sVar2;
  const_iterator cVar3;
  string_view sVar4;
  HierarchicalInstanceSyntax *instanceSyntax;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range3;
  NetType *netType;
  ASTContext context;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *in_stack_fffffffffffffe98;
  self_type *in_stack_fffffffffffffea0;
  Scope *in_stack_fffffffffffffea8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffeb0;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *local_100;
  self_type *local_f8;
  ASTContext *local_f0;
  HierarchicalInstanceSyntax *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28 [16];
  string_view in_stack_ffffffffffffff38;
  pointer in_stack_ffffffffffffff50;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60 [16];
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,NonProcedural);
  ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x3a5a0a);
  implicitNetNames_00 = Scope::getDefaultNetType(in_stack_fffffffffffffea8);
  if (in_RDX == 0) {
    sVar2 = (string_view)
            slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a5b1c);
    cVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a5b39);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                             (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      instanceSyntax_00 =
           iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                        *)0x3a5b76);
      sVar4 = parsing::Token::valueText((Token *)in_stack_fffffffffffffeb0.m_bits);
      context_00 = (ASTContext *)sVar4._M_str;
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x3a5bcd);
      params_00._M_extent._M_extent_value = in_stack_ffffffffffffff58._M_extent_value;
      params_00._M_ptr = in_stack_ffffffffffffff50;
      in_stack_fffffffffffffe98 = local_100;
      in_stack_fffffffffffffea0 = local_f8;
      in_stack_fffffffffffffeb0.m_bits = (underlying_type)in_R9;
      createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
                ((Compilation *)cVar3.index,(PrimitiveInstantiationSyntax *)cVar3.list,
                 instanceSyntax_00,sVar2,context_00,params_00,in_stack_ffffffffffffff60._0_8_,
                 in_stack_ffffffffffffff60._8_8_,
                 (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                  *)implicitNetNames_00,(NetType *)in_stack_ffffffffffffff78.m_bits);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                  *)in_stack_fffffffffffffea0);
    }
  }
  else {
    sVar2 = parsing::Token::valueText((Token *)in_stack_fffffffffffffeb0.m_bits);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x3a5a7e);
    params._M_extent._M_extent_value = in_stack_ffffffffffffff58._M_extent_value;
    params._M_ptr = in_stack_ffffffffffffff50;
    createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
              (in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff38,local_f0,params,
               (SmallVectorBase<const_slang::ast::Symbol_*> *)sVar2._M_len,
               (SmallVectorBase<const_slang::ast::Symbol_*> *)sVar2._M_str,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)implicitNetNames_00,(NetType *)in_stack_ffffffffffffff78.m_bits);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const PrimitiveInstantiationSyntax& syntax,
                                         const syntax::HierarchicalInstanceSyntax* specificInstance,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets,
                                         SmallSet<std::string_view, 8>& implicitNetNames) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, {}, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, {}, results, implicitNets, implicitNetNames, netType);
        }
    }
}